

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnGlobalGet(SharedValidator *this,Location *loc,Var *global_var)

{
  Result RVar1;
  Result RVar2;
  Result RVar3;
  char *pcVar4;
  int __c;
  Enum EVar5;
  Type __s;
  GlobalType global_type;
  Var local_78;
  
  RVar1 = CheckInstr(this,(Opcode)0x1c,loc);
  global_type.type.enum_ = Any;
  global_type.type.type_index_ = 0xffffffff;
  global_type.mutable_ = true;
  Var::Var(&local_78,global_var);
  RVar2 = CheckGlobalIndex(this,&local_78,&global_type);
  Var::~Var(&local_78);
  __s = global_type.type;
  RVar3 = TypeChecker::OnGlobalGet(&this->typechecker_,global_type.type);
  EVar5 = Error;
  if ((((RVar1.enum_ != Error) && (RVar2.enum_ != Error)) && (RVar3.enum_ != Error)) &&
     (EVar5 = Ok, this->in_init_expr_ == true)) {
    pcVar4 = Var::index(global_var,(char *)__s,__c);
    EVar5 = Ok;
    if (this->num_imported_globals_ <= (uint)pcVar4) {
      RVar1 = PrintError(this,&global_var->loc,
                         "initializer expression can only reference an imported global");
      EVar5 = (Enum)(RVar1.enum_ == Error);
    }
    if (global_type.mutable_ == true) {
      RVar1 = PrintError(this,loc,"initializer expression cannot reference a mutable global");
      EVar5 = (Enum)(byte)(RVar1.enum_ == Error | (byte)EVar5);
    }
  }
  return (Result)EVar5;
}

Assistant:

Result SharedValidator::OnGlobalGet(const Location& loc, Var global_var) {
  Result result = CheckInstr(Opcode::GlobalGet, loc);
  GlobalType global_type;
  result |= CheckGlobalIndex(global_var, &global_type);
  result |= typechecker_.OnGlobalGet(global_type.type);
  if (Succeeded(result) && in_init_expr_) {
    if (global_var.index() >= num_imported_globals_) {
      result |= PrintError(
          global_var.loc,
          "initializer expression can only reference an imported global");
    }
    if (global_type.mutable_) {
      result |= PrintError(
          loc, "initializer expression cannot reference a mutable global");
    }
  }

  return result;
}